

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grain_synthesis.c
# Opt level: O3

void add_noise_to_block(aom_film_grain_t *params,uint8_t *luma,uint8_t *cb,uint8_t *cr,
                       int luma_stride,int chroma_stride,int *luma_grain,int *cb_grain,int *cr_grain
                       ,int luma_grain_stride,int chroma_grain_stride,int half_luma_height,
                       int half_luma_width,int bit_depth,int chroma_subsamp_y,int chroma_subsamp_x,
                       int mc_identity)

{
  byte bVar1;
  int iVar2;
  uint8_t uVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  int x;
  int iVar7;
  ulong uVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  int iVar12;
  uint uVar13;
  int iVar14;
  int iVar15;
  ulong uVar16;
  int iVar17;
  int iVar18;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  int local_94;
  int local_90;
  int local_8c;
  int local_88;
  int local_84;
  int local_80;
  ulong local_78;
  uint8_t *local_70;
  int *local_60;
  int *local_58;
  uint uVar19;
  
  iVar9 = 1 << ((char)params->scaling_shift - 1U & 0x1f);
  bVar20 = true;
  if (params->num_cb_points < 1) {
    bVar20 = params->chroma_scaling_from_luma != 0;
  }
  iVar5 = params->num_cr_points;
  bVar21 = params->chroma_scaling_from_luma == 0;
  if (bVar21) {
    local_90 = params->cb_mult + -0x80;
    local_8c = params->cb_luma_mult + -0x80;
    local_94 = params->cb_offset + -0x100;
    local_88 = params->cr_mult + -0x80;
    local_84 = params->cr_luma_mult + -0x80;
    local_80 = params->cr_offset + -0x100;
  }
  else {
    local_80 = 0;
    local_84 = 0x40;
    local_88 = 0;
    local_94 = 0;
    local_8c = 0x40;
    local_90 = 0;
  }
  iVar17 = params->num_y_points;
  bVar22 = params->clip_to_restricted_range != 0;
  iVar10 = (uint)(mc_identity == 0) * 5 + 0xeb;
  iVar2 = 0xeb;
  if (!bVar22) {
    iVar10 = 0xff;
    iVar2 = 0xff;
  }
  uVar19 = (uint)bVar22;
  iVar18 = uVar19 * 0x10;
  bVar1 = 1 - (byte)chroma_subsamp_y & 0x1f;
  if (0 < half_luma_height << bVar1) {
    local_58 = cr_grain;
    local_60 = cb_grain;
    uVar11 = half_luma_width << (1U - (char)chroma_subsamp_x & 0x1f);
    iVar12 = (0x100 << ((char)bit_depth - 8U & 0x1f)) + -1;
    local_78 = 0;
    local_70 = cb;
    do {
      if (0 < (int)uVar11) {
        iVar15 = ((int)local_78 << ((byte)chroma_subsamp_y & 0x1f)) * luma_stride;
        lVar6 = (long)iVar15;
        uVar16 = 0;
        do {
          if (chroma_subsamp_x == 0) {
            uVar13 = (uint)luma[uVar16 + lVar6];
          }
          else {
            uVar13 = (uint)luma[(long)iVar15 + 1] + (uint)luma[iVar15] + 1 >> 1 & 0xff;
          }
          if (bVar20) {
            iVar4 = ((int)(local_90 * (uint)local_70[uVar16] + uVar13 * local_8c) >> 6) + local_94;
            iVar7 = iVar4;
            if (iVar12 <= iVar4) {
              iVar7 = iVar12;
            }
            if (iVar4 < 0) {
              iVar7 = 0;
            }
            iVar4 = (local_60[uVar16] * scaling_lut_cb[iVar7] + iVar9 >>
                    ((byte)params->scaling_shift & 0x1f)) + (uint)local_70[uVar16];
            iVar7 = iVar4;
            if (iVar10 <= iVar4) {
              iVar7 = iVar10;
            }
            iVar14 = iVar18;
            if (SBORROW4(iVar4,iVar18) == (int)(iVar4 + uVar19 * -0x10) < 0) {
              iVar14 = iVar7;
            }
            local_70[uVar16] = (uint8_t)iVar14;
          }
          if (0 < iVar5 || !bVar21) {
            iVar4 = ((int)(local_88 * (uint)cr[uVar16] + uVar13 * local_84) >> 6) + local_80;
            iVar7 = iVar4;
            if (iVar12 <= iVar4) {
              iVar7 = iVar12;
            }
            if (iVar4 < 0) {
              iVar7 = 0;
            }
            iVar4 = (local_58[uVar16] * scaling_lut_cr[iVar7] + iVar9 >>
                    ((byte)params->scaling_shift & 0x1f)) + (uint)cr[uVar16];
            iVar7 = iVar4;
            if (iVar10 <= iVar4) {
              iVar7 = iVar10;
            }
            iVar14 = iVar18;
            if (SBORROW4(iVar4,iVar18) == (int)(iVar4 + uVar19 * -0x10) < 0) {
              iVar14 = iVar7;
            }
            cr[uVar16] = (uint8_t)iVar14;
          }
          uVar16 = uVar16 + 1;
          iVar15 = iVar15 + 2;
        } while (uVar11 != uVar16);
      }
      local_78 = local_78 + 1;
      local_58 = local_58 + chroma_grain_stride;
      cr = cr + chroma_stride;
      local_60 = local_60 + chroma_grain_stride;
      local_70 = local_70 + chroma_stride;
    } while (local_78 != (uint)(half_luma_height << bVar1));
  }
  if ((0 < iVar17) && (0 < half_luma_height * 2)) {
    uVar16 = 0;
    do {
      if (0 < half_luma_width * 2) {
        uVar8 = 0;
        do {
          iVar17 = (luma_grain[uVar8] * scaling_lut_y[luma[uVar8]] + iVar9 >>
                   ((byte)params->scaling_shift & 0x1f)) + (uint)luma[uVar8];
          iVar5 = iVar17;
          if (iVar2 <= iVar17) {
            iVar5 = iVar2;
          }
          uVar3 = (uint8_t)iVar5;
          if (SBORROW4(iVar17,iVar18) != (int)(iVar17 + uVar19 * -0x10) < 0) {
            uVar3 = (uint8_t)iVar18;
          }
          luma[uVar8] = uVar3;
          uVar8 = uVar8 + 1;
        } while ((uint)(half_luma_width * 2) != uVar8);
      }
      uVar16 = uVar16 + 1;
      luma_grain = luma_grain + luma_grain_stride;
      luma = luma + luma_stride;
    } while (uVar16 != (uint)(half_luma_height * 2));
  }
  return;
}

Assistant:

static void add_noise_to_block(const aom_film_grain_t *params, uint8_t *luma,
                               uint8_t *cb, uint8_t *cr, int luma_stride,
                               int chroma_stride, int *luma_grain,
                               int *cb_grain, int *cr_grain,
                               int luma_grain_stride, int chroma_grain_stride,
                               int half_luma_height, int half_luma_width,
                               int bit_depth, int chroma_subsamp_y,
                               int chroma_subsamp_x, int mc_identity) {
  int cb_mult = params->cb_mult - 128;            // fixed scale
  int cb_luma_mult = params->cb_luma_mult - 128;  // fixed scale
  int cb_offset = params->cb_offset - 256;

  int cr_mult = params->cr_mult - 128;            // fixed scale
  int cr_luma_mult = params->cr_luma_mult - 128;  // fixed scale
  int cr_offset = params->cr_offset - 256;

  int rounding_offset = (1 << (params->scaling_shift - 1));

  int apply_y = params->num_y_points > 0 ? 1 : 0;
  int apply_cb =
      (params->num_cb_points > 0 || params->chroma_scaling_from_luma) ? 1 : 0;
  int apply_cr =
      (params->num_cr_points > 0 || params->chroma_scaling_from_luma) ? 1 : 0;

  if (params->chroma_scaling_from_luma) {
    cb_mult = 0;        // fixed scale
    cb_luma_mult = 64;  // fixed scale
    cb_offset = 0;

    cr_mult = 0;        // fixed scale
    cr_luma_mult = 64;  // fixed scale
    cr_offset = 0;
  }

  int min_luma, max_luma, min_chroma, max_chroma;

  if (params->clip_to_restricted_range) {
    min_luma = min_luma_legal_range;
    max_luma = max_luma_legal_range;

    if (mc_identity) {
      min_chroma = min_luma_legal_range;
      max_chroma = max_luma_legal_range;
    } else {
      min_chroma = min_chroma_legal_range;
      max_chroma = max_chroma_legal_range;
    }
  } else {
    min_luma = min_chroma = 0;
    max_luma = max_chroma = 255;
  }

  for (int i = 0; i < (half_luma_height << (1 - chroma_subsamp_y)); i++) {
    for (int j = 0; j < (half_luma_width << (1 - chroma_subsamp_x)); j++) {
      int average_luma = 0;
      if (chroma_subsamp_x) {
        average_luma = (luma[(i << chroma_subsamp_y) * luma_stride +
                             (j << chroma_subsamp_x)] +
                        luma[(i << chroma_subsamp_y) * luma_stride +
                             (j << chroma_subsamp_x) + 1] +
                        1) >>
                       1;
      } else {
        average_luma = luma[(i << chroma_subsamp_y) * luma_stride + j];
      }

      if (apply_cb) {
        cb[i * chroma_stride + j] = clamp(
            cb[i * chroma_stride + j] +
                ((scale_LUT(scaling_lut_cb,
                            clamp(((average_luma * cb_luma_mult +
                                    cb_mult * cb[i * chroma_stride + j]) >>
                                   6) +
                                      cb_offset,
                                  0, (256 << (bit_depth - 8)) - 1),
                            8) *
                      cb_grain[i * chroma_grain_stride + j] +
                  rounding_offset) >>
                 params->scaling_shift),
            min_chroma, max_chroma);
      }

      if (apply_cr) {
        cr[i * chroma_stride + j] = clamp(
            cr[i * chroma_stride + j] +
                ((scale_LUT(scaling_lut_cr,
                            clamp(((average_luma * cr_luma_mult +
                                    cr_mult * cr[i * chroma_stride + j]) >>
                                   6) +
                                      cr_offset,
                                  0, (256 << (bit_depth - 8)) - 1),
                            8) *
                      cr_grain[i * chroma_grain_stride + j] +
                  rounding_offset) >>
                 params->scaling_shift),
            min_chroma, max_chroma);
      }
    }
  }

  if (apply_y) {
    for (int i = 0; i < (half_luma_height << 1); i++) {
      for (int j = 0; j < (half_luma_width << 1); j++) {
        luma[i * luma_stride + j] =
            clamp(luma[i * luma_stride + j] +
                      ((scale_LUT(scaling_lut_y, luma[i * luma_stride + j], 8) *
                            luma_grain[i * luma_grain_stride + j] +
                        rounding_offset) >>
                       params->scaling_shift),
                  min_luma, max_luma);
      }
    }
  }
}